

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O2

wchar_t * c__next_word(wchar_t *p,wchar_t *high,wchar_t n,_func_wchar_t_wint_t *wtest)

{
  wchar_t wVar1;
  bool bVar2;
  
  while (bVar2 = n != L'\0', n = n + L'\xffffffff', bVar2) {
    while ((p < high && (wVar1 = (*wtest)(*p), wVar1 == L'\0'))) {
      p = p + 1;
    }
    while ((p < high && (wVar1 = (*wtest)(*p), wVar1 != L'\0'))) {
      p = p + 1;
    }
  }
  if (high < p) {
    p = high;
  }
  return p;
}

Assistant:

libedit_private wchar_t *
c__next_word(wchar_t *p, wchar_t *high, int n, int (*wtest)(wint_t))
{
	while (n--) {
		while ((p < high) && !(*wtest)(*p))
			p++;
		while ((p < high) && (*wtest)(*p))
			p++;
	}
	if (p > high)
		p = high;
	/* p now points where we want it */
	return p;
}